

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11disp.c
# Opt level: O1

void x11_free_display(X11Display *disp)

{
  safefree(disp->hostname);
  safefree(disp->unixsocketpath);
  if (disp->localauthdata != (uchar *)0x0) {
    smemclr(disp->localauthdata,(long)disp->localauthdatalen);
  }
  safefree(disp->localauthdata);
  sk_addr_free(disp->addr);
  safefree(disp);
  return;
}

Assistant:

void x11_free_display(struct X11Display *disp)
{
    sfree(disp->hostname);
    sfree(disp->unixsocketpath);
    if (disp->localauthdata)
        smemclr(disp->localauthdata, disp->localauthdatalen);
    sfree(disp->localauthdata);
    sk_addr_free(disp->addr);
    sfree(disp);
}